

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.c
# Opt level: O0

mp_int * provableprime_generate_inner
                   (ProvablePrimeContext *ppc,PrimeCandidateSource *pcs,ProgressReceiver *prog,
                   double progress_origin,double progress_scale)

{
  int iVar1;
  bool bVar2;
  PrimeCandidateSource *ppc_00;
  uint uVar3;
  PockleStatus PVar4;
  mp_int *pmVar5;
  size_t sVar6;
  ulong uVar7;
  PrimeCandidateSource *pcs_00;
  mp_int **factors_00;
  double dVar8;
  uint local_168;
  PockleStatus st;
  mp_int **factors_1;
  size_t nfactors_1;
  mp_int *witness;
  MillerRabin *mr;
  mp_int *p;
  mp_int *q;
  double progress_in_this_prime;
  ulong uStack_120;
  uint sub_bits_1;
  size_t i_3;
  ulong uStack_110;
  uint this_size;
  size_t i_2;
  uint max_total;
  uint min_total;
  double sum;
  size_t i_1;
  double u;
  double range;
  size_t ssize;
  size_t ns;
  double *s;
  double uniform;
  uint local_b8;
  uint sub_bits;
  uint real_max;
  uint real_min;
  size_t sizesize;
  size_t nsizes;
  uint *sizes;
  double progress;
  mp_int *to_free_2;
  mp_int *to_free_1;
  mp_int *size_needed;
  mp_int *upperbound;
  mp_int *to_free;
  size_t i;
  mp_int **factors;
  size_t nfactors;
  mp_int *size_got;
  uint local_40;
  uint max_bits_needed;
  uint min_bits_needed;
  uint bits;
  double progress_scale_local;
  double progress_origin_local;
  ProgressReceiver *prog_local;
  PrimeCandidateSource *pcs_local;
  ProvablePrimeContext *ppc_local;
  
  _min_bits_needed = progress_scale;
  progress_scale_local = progress_origin;
  progress_origin_local = (double)prog;
  prog_local = (ProgressReceiver *)pcs;
  pcs_local = (PrimeCandidateSource *)ppc;
  max_bits_needed = pcs_get_bits(pcs);
  if (max_bits_needed < 2) {
    __assert_fail("bits > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                  ,0x14a,
                  "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                 );
  }
  if (max_bits_needed < 0x21) {
    ppc_local = (ProvablePrimeContext *)
                primegen_small(*(Pockle **)pcs_local,(PrimeCandidateSource *)prog_local);
  }
  else {
    nfactors = (size_t)mp_from_integer(1);
    i = (size_t)pcs_get_known_prime_factors((PrimeCandidateSource *)prog_local,(size_t *)&factors);
    for (to_free = (mp_int *)0x0; to_free < factors; to_free = (mp_int *)((long)&to_free->nw + 1)) {
      upperbound = (mp_int *)nfactors;
      pmVar5 = mp_mul((mp_int *)nfactors,*(mp_int **)(i + (long)to_free * 8));
      nfactors = (size_t)mp_unsafe_shrink(pmVar5);
      mp_free(upperbound);
    }
    size_needed = pcs_get_upper_bound((PrimeCandidateSource *)prog_local);
    to_free_1 = mp_nthroot(size_needed,3,(mp_int *)0x0);
    to_free_2 = size_needed;
    pmVar5 = mp_div(size_needed,(mp_int *)nfactors);
    size_needed = mp_unsafe_shrink(pmVar5);
    mp_free(to_free_2);
    progress = (double)to_free_1;
    pmVar5 = mp_ceil_div(to_free_1,(mp_int *)nfactors);
    to_free_1 = mp_unsafe_shrink(pmVar5);
    mp_free((mp_int *)progress);
    size_got._4_4_ = pcs_get_bits_remaining((PrimeCandidateSource *)prog_local);
    uVar3 = mp_hs_integer(to_free_1,2);
    if (uVar3 == 0) {
      local_40 = 0;
    }
    else {
      sVar6 = mp_get_nbits(to_free_1);
      local_40 = (int)sVar6 + 1;
    }
    mp_free(size_needed);
    mp_free(to_free_1);
    mp_free((mp_int *)nfactors);
    sizes = (uint *)0x0;
    if (local_40 != 0) {
      nsizes = 0;
      sizesize = 0;
      _real_max = 0;
      sub_bits = size_got._4_4_ >> 1;
      if (size_got._4_4_ < 0x14) {
        local_168 = 0;
      }
      else {
        local_168 = size_got._4_4_ - 0x14;
      }
      local_b8 = local_168;
      if (sub_bits < local_40) {
        sub_bits = local_40;
      }
      if (local_168 < sub_bits) {
        local_b8 = sub_bits;
      }
      iVar1 = (int)pcs_local->factor->nw;
      if (iVar1 == 0) {
        nsizes = (size_t)safegrowarray((void *)0x0,(size_t *)&real_max,4,0,1,false);
        *(uint *)(nsizes + sizesize * 4) = local_40;
        sizesize = sizesize + 1;
      }
      else {
        if (iVar1 != 1) {
          if (iVar1 != 2) {
            __assert_fail("false && \"bad subprime policy\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                          ,0x261,
                          "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                         );
          }
          if ((size_got._4_4_ >> 1) + 1 <= local_b8) {
            ns = 0;
            range = 0.0;
            do {
              ssize = 0;
              u = 1.0;
LAB_0011b1ff:
              dVar8 = uniform_random_double();
              i_1 = (size_t)(dVar8 * u);
              u = u - (double)i_1;
              ns = (size_t)safegrowarray((void *)ns,(size_t *)&range,8,ssize,1,false);
              sum = (double)ssize;
              while( true ) {
                bVar2 = false;
                if (sum != 0.0) {
                  bVar2 = *(double *)(ns + ((long)sum + -1) * 8) < (double)i_1;
                }
                if (!bVar2) break;
                *(undefined8 *)(ns + (long)sum * 8) = *(undefined8 *)(ns + ((long)sum + -1) * 8);
                sum = (double)((long)sum + -1);
              }
              *(size_t *)(ns + (long)sum * 8) = i_1;
              ssize = ssize + 1;
              _max_total = 0.0;
              sum = 0.0;
LAB_0011b33b:
              if (ssize <= (ulong)sum) goto LAB_0011b1ff;
              _max_total = *(double *)(ns + (long)sum * 8) + _max_total;
              if (_max_total + *(double *)(ns + (long)sum * 8) <= 1.0) goto LAB_0011b3ad;
              ssize = (long)sum + 1;
              sizesize = 0;
              i_2._4_4_ = 0;
              i_2._0_4_ = 0;
              for (uStack_110 = 0; uStack_110 < ssize; uStack_110 = uStack_110 + 1) {
                i_3._4_4_ = (int)(long)((double)size_got._4_4_ * *(double *)(ns + uStack_110 * 8) +
                                       1.0);
                nsizes = (size_t)safegrowarray((void *)nsizes,(size_t *)&real_max,4,sizesize,1,false
                                              );
                *(int *)(nsizes + sizesize * 4) = i_3._4_4_;
                i_2._4_4_ = i_3._4_4_ + -1 + i_2._4_4_;
                i_2._0_4_ = i_3._4_4_ + (uint)i_2;
                sizesize = sizesize + 1;
              }
              if ((sub_bits <= i_2._4_4_) && ((uint)i_2 <= local_b8 + 1)) {
                smemclr((void *)ns,(long)range << 3);
                safefree((void *)ns);
                goto LAB_0011b53d;
              }
            } while( true );
          }
        }
        do {
          s = (double *)uniform_random_double();
          uVar7 = (ulong)local_b8;
          dVar8 = pow(2.0,(double)s + -1.0);
          uniform._4_4_ = (uint)(long)((double)uVar7 * dVar8 + 0.5);
        } while (uniform._4_4_ < sub_bits || local_b8 < uniform._4_4_);
        nsizes = (size_t)safegrowarray((void *)nsizes,(size_t *)&real_max,4,sizesize,1,false);
        *(uint *)(nsizes + sizesize * 4) = uniform._4_4_;
        sizesize = sizesize + 1;
      }
LAB_0011b53d:
      for (uStack_120 = 0; ppc_00 = pcs_local, uStack_120 < sizesize; uStack_120 = uStack_120 + 1) {
        progress_in_this_prime._4_4_ = *(uint *)(nsizes + uStack_120 * 4);
        q = (mp_int *)((double)progress_in_this_prime._4_4_ / (double)max_bits_needed);
        pcs_00 = pcs_new(progress_in_this_prime._4_4_);
        p = provableprime_generate_inner
                      ((ProvablePrimeContext *)ppc_00,pcs_00,
                       (ProgressReceiver *)progress_origin_local,
                       _min_bits_needed * (double)sizes + progress_scale_local,
                       _min_bits_needed * (double)q);
        sizes = (uint *)((double)q + (double)sizes);
        if (p == (mp_int *)0x0) {
          __assert_fail("q",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                        ,0x26c,
                        "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                       );
        }
        pcs_require_residue_1_mod_prime((PrimeCandidateSource *)prog_local,p);
        mp_free(p);
      }
      smemclr((void *)nsizes,_real_max << 2);
      safefree((void *)nsizes);
    }
    pcs_ready((PrimeCandidateSource *)prog_local);
    while (mr = (MillerRabin *)pcs_generate((PrimeCandidateSource *)prog_local),
          mr != (MillerRabin *)0x0) {
      witness = (mp_int *)miller_rabin_new((mp_int *)mr);
      nfactors_1 = (size_t)miller_rabin_find_potential_primitive_root((MillerRabin *)witness);
      miller_rabin_free((MillerRabin *)witness);
      if (nfactors_1 == 0) {
        mp_free((mp_int *)mr);
      }
      else {
        factors_00 = pcs_get_known_prime_factors
                               ((PrimeCandidateSource *)prog_local,(size_t *)&factors_1);
        PVar4 = pockle_add_prime(*(Pockle **)pcs_local,(mp_int *)mr,factors_00,(size_t)factors_1,
                                 (mp_int *)nfactors_1);
        if (PVar4 == POCKLE_OK) {
          mp_free((mp_int *)nfactors_1);
          pcs_free((PrimeCandidateSource *)prog_local);
          progress_report((ProgressReceiver *)progress_origin_local,
                          progress_scale_local + _min_bits_needed);
          return (mp_int *)mr;
        }
        if (((PVar4 != POCKLE_DISCRIMINANT_IS_SQUARE) && (PVar4 != POCKLE_WITNESS_POWER_IS_1)) &&
           (PVar4 != POCKLE_WITNESS_POWER_NOT_COPRIME)) {
          __assert_fail("st == POCKLE_DISCRIMINANT_IS_SQUARE || st == POCKLE_WITNESS_POWER_IS_1 || st == POCKLE_WITNESS_POWER_NOT_COPRIME"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/prime.c"
                        ,0x2a2,
                        "mp_int *provableprime_generate_inner(ProvablePrimeContext *, PrimeCandidateSource *, ProgressReceiver *, double, double)"
                       );
        }
        mp_free((mp_int *)mr);
        if (nfactors_1 != 0) {
          mp_free((mp_int *)nfactors_1);
        }
      }
    }
    pcs_free((PrimeCandidateSource *)prog_local);
    ppc_local = (ProvablePrimeContext *)0x0;
  }
  return (mp_int *)ppc_local;
LAB_0011b3ad:
  sum = (double)((long)sum + 1);
  goto LAB_0011b33b;
}

Assistant:

static mp_int *provableprime_generate_inner(
    ProvablePrimeContext *ppc, PrimeCandidateSource *pcs,
    ProgressReceiver *prog, double progress_origin, double progress_scale)
{
    unsigned bits = pcs_get_bits(pcs);
    assert(bits > 1);

    if (bits <= 32) {
        debug_f("ppgi(%u) -> small", bits);
        return primegen_small(ppc->pockle, pcs);
    }

    unsigned min_bits_needed, max_bits_needed;
    {
        /*
         * Find the product of all the prime factors we already know
         * about.
         */
        mp_int *size_got = mp_from_integer(1);
        size_t nfactors;
        mp_int **factors = pcs_get_known_prime_factors(pcs, &nfactors);
        for (size_t i = 0; i < nfactors; i++) {
            mp_int *to_free = size_got;
            size_got = mp_unsafe_shrink(mp_mul(size_got, factors[i]));
            mp_free(to_free);
        }

        /*
         * Find the largest cofactor we might be able to use, and the
         * smallest one we can get away with.
         */
        mp_int *upperbound = pcs_get_upper_bound(pcs);
        mp_int *size_needed = mp_nthroot(upperbound, 3, NULL);
        debug_f_mp("upperbound = ", upperbound);
        {
            mp_int *to_free = upperbound;
            upperbound = mp_unsafe_shrink(mp_div(upperbound, size_got));
            mp_free(to_free);
        }
        debug_f_mp("size_needed = ", size_needed);
        {
            mp_int *to_free = size_needed;
            size_needed = mp_unsafe_shrink(mp_ceil_div(size_needed, size_got));
            mp_free(to_free);
        }

        max_bits_needed = pcs_get_bits_remaining(pcs);

        /*
         * We need a prime that is greater than or equal to
         * 'size_needed' in order for the product of all our known
         * factors of p-1 to exceed the cube root of the largest value
         * p might take.
         *
         * Since pcs_new wants a size specified in bits, we must count
         * the bits in size_needed and then add 1. Otherwise we might
         * get a value with the same bit count as size_needed but
         * slightly smaller than it.
         *
         * An exception is if size_needed = 1. In that case the
         * product of existing known factors is _already_ enough, so
         * we don't need to generate an extra factor at all.
         */
        if (mp_hs_integer(size_needed, 2)) {
            min_bits_needed = mp_get_nbits(size_needed) + 1;
        } else {
            min_bits_needed = 0;
        }

        mp_free(upperbound);
        mp_free(size_needed);
        mp_free(size_got);
    }

    double progress = 0.0;

    if (min_bits_needed) {
        debug_f("ppgi(%u) recursing, need [%u,%u] more bits",
                bits, min_bits_needed, max_bits_needed);

        unsigned *sizes = NULL;
        size_t nsizes = 0, sizesize = 0;

        unsigned real_min = max_bits_needed / 2;
        unsigned real_max = (max_bits_needed >= 20 ?
                             max_bits_needed - 20 : 0);
        if (real_min < min_bits_needed)
            real_min = min_bits_needed;
        if (real_max < real_min)
            real_max = real_min;
        debug_f("ppgi(%u) revised bits interval = [%u,%u]",
                bits, real_min, real_max);

        switch (ppc->extra->spp) {
          case SPP_FAST:
            /*
             * Always pick the smallest subsidiary prime we can get
             * away with: just over n/3 bits.
             *
             * This is not a good mode for cryptographic prime
             * generation, because it skews the distribution of primes
             * greatly, and worse, it skews them in a direction that
             * heads away from the properties crypto algorithms tend
             * to like.
             *
             * (For both discrete-log systems and RSA, people have
             * tended to recommend in the past that p-1 should have a
             * _large_ factor if possible. There's some disagreement
             * on which algorithms this is really necessary for, but
             * certainly I've never seen anyone recommend arranging a
             * _small_ factor on purpose.)
             *
             * I originally implemented this mode because it was
             * convenient for debugging - it wastes as little time as
             * possible on finding a sub-prime and lets you get to the
             * interesting part! And I leave it in the code because it
             * might still be useful for _something_. Because it's
             * cryptographically questionable, it's not selectable in
             * the UI of either version of PuTTYgen proper; but it can
             * be accessed through testcrypt, and if for some reason a
             * definite prime is needed for non-crypto purposes, it
             * may still be the fastest way to put your hands on one.
             */
            debug_f("ppgi(%u) fast mode, just ask for %u bits",
                    bits, min_bits_needed);
            sgrowarray(sizes, sizesize, nsizes);
            sizes[nsizes++] = min_bits_needed;
            break;
          case SPP_MAURER_SIMPLE: {
            /*
             * Select the size of the subsidiary prime at random from
             * sqrt(outputprime) up to outputprime/2^20, in such a way
             * that the probability distribution matches that of the
             * largest prime factor of a random n-bit number.
             *
             * Per [MAURER] section 3.4, the cumulative distribution
             * function of this relative size is 1+log2(x), for x in
             * [1/2,1]. You can generate a value from the distribution
             * given by a cdf by applying the inverse cdf to a uniform
             * value in [0,1]. Simplifying that in this case, what we
             * have to do is raise 2 to the power of a random real
             * number between -1 and 0. (And that gives you the number
             * of _bits_ in the sub-prime, as a factor of the desired
             * output number of bits.)
             *
             * We also require that the subsidiary prime q is at least
             * 20 bits smaller than the output one, to give us a
             * fighting chance of there being _any_ prime we can find
             * such that q | p-1.
             *
             * (But these rules have to be applied in an order that
             * still leaves us _some_ interval of possible sizes we
             * can pick!)
             */
          maurer_simple:
            debug_f("ppgi(%u) Maurer simple mode", bits);

            unsigned sub_bits;
            do {
                double uniform = uniform_random_double();
                sub_bits = real_max * pow(2.0, uniform - 1) + 0.5;
                debug_f(" ... %.6f -> %u?", uniform, sub_bits);
            } while (!(real_min <= sub_bits && sub_bits <= real_max));

            debug_f("ppgi(%u) asking for %u bits", bits, sub_bits);
            sgrowarray(sizes, sizesize, nsizes);
            sizes[nsizes++] = sub_bits;

            break;
          }
          case SPP_MAURER_COMPLEX: {
            /*
             * In this mode, we may generate multiple factors of p-1
             * which between them add up to at least n/2 bits, in such
             * a way that those are guaranteed to be the largest
             * factors of p-1 and that they have the same probability
             * distribution as the largest k factors would have in a
             * random integer. The idea is that this more elaborate
             * procedure gets as close as possible to the same
             * probability distribution you'd get by selecting a
             * completely random prime (if you feasibly could).
             *
             * Algorithm from Appendix 1 of [MAURER]: we generate
             * random real numbers that sum to at most 1, by choosing
             * each one uniformly from the range [0, 1 - sum of all
             * the previous ones]. We maintain them in a list in
             * decreasing order, and we stop as soon as we find an
             * initial subsequence of the list s_1,...,s_r such that
             * s_1 + ... + s_{r-1} + 2 s_r > 1. In particular, this
             * guarantees that the sum of that initial subsequence is
             * at least 1/2, so we end up with enough factors to
             * satisfy Pocklington.
             */

            if (max_bits_needed / 2 + 1 > real_max) {
                /* Early exit path in the case where this algorithm
                 * can't possibly generate a value in the range we
                 * need. In that situation, fall back to Maurer
                 * simple. */
                debug_f("ppgi(%u) skipping GenerateSizeList, "
                        "real_max too small", bits);
                goto maurer_simple;    /* sorry! */
            }

            double *s = NULL;
            size_t ns, ssize = 0;

            while (true) {
                debug_f("ppgi(%u) starting GenerateSizeList", bits);
                ns = 0;
                double range = 1.0;
                while (true) {
                    /* Generate the next number */
                    double u = uniform_random_double() * range;
                    range -= u;
                    debug_f("  u_%"SIZEu" = %g", ns, u);

                    /* Insert it in the list */
                    sgrowarray(s, ssize, ns);
                    size_t i;
                    for (i = ns; i > 0 && s[i-1] < u; i--)
                        s[i] = s[i-1];
                    s[i] = u;
                    ns++;
                    debug_f("    inserting as s[%"SIZEu"]", i);

                    /* Look for a suitable initial subsequence */
                    double sum = 0;
                    for (i = 0; i < ns; i++) {
                        sum += s[i];
                        if (sum + s[i] > 1.0) {
                            debug_f("  s[0..%"SIZEu"] works!", i);

                            /* Truncate the sequence here, and stop
                             * generating random real numbers. */
                            ns = i+1;
                            goto got_list;
                        }
                    }
                }

              got_list:;
                /*
                 * Now translate those real numbers into actual bit
                 * counts, and do a last-minute check to make sure
                 * their product is going to be in range.
                 *
                 * We have to check both the min and max sizes of the
                 * total. A b-bit number is in [2^{b-1},2^b). So the
                 * product of numbers of sizes b_1,...,b_k is at least
                 * 2^{\sum (b_i-1)}, and less than 2^{\sum b_i}.
                 */
                nsizes = 0;

                unsigned min_total = 0, max_total = 0;

                for (size_t i = 0; i < ns; i++) {
                    /* These sizes are measured in actual entropy, so
                     * add 1 bit each time to account for the
                     * zero-information leading 1 */
                    unsigned this_size = max_bits_needed * s[i] + 1;
                    debug_f("  bits[%"SIZEu"] = %u", i, this_size);
                    sgrowarray(sizes, sizesize, nsizes);
                    sizes[nsizes++] = this_size;

                    min_total += this_size - 1;
                    max_total += this_size;
                }

                debug_f("  total bits = [%u,%u)", min_total, max_total);
                if (min_total < real_min || max_total > real_max+1) {
                    debug_f("  total out of range, try again");
                } else {
                    debug_f("  success! %"SIZEu" sub-primes totalling [%u,%u) "
                            "bits", nsizes, min_total, max_total);
                    break;
                }
            }

            smemclr(s, ssize * sizeof(*s));
            sfree(s);
            break;
          }
          default:
            unreachable("bad subprime policy");
        }

        for (size_t i = 0; i < nsizes; i++) {
            unsigned sub_bits = sizes[i];
            double progress_in_this_prime = (double)sub_bits / bits;
            mp_int *q = provableprime_generate_inner(
                ppc, pcs_new(sub_bits),
                prog, progress_origin + progress_scale * progress,
                progress_scale * progress_in_this_prime);
            progress += progress_in_this_prime;
            assert(q);
            debug_f_mp("ppgi(%u) got factor ", q, bits);
            pcs_require_residue_1_mod_prime(pcs, q);
            mp_free(q);
        }

        smemclr(sizes, sizesize * sizeof(*sizes));
        sfree(sizes);
    } else {
        debug_f("ppgi(%u) no need to recurse", bits);
    }

    debug_f("ppgi(%u) ready, %u bits remaining",
            bits, pcs_get_bits_remaining(pcs));
    pcs_ready(pcs);

    while (true) {
        mp_int *p = pcs_generate(pcs);
        if (!p) {
            pcs_free(pcs);
            return NULL;
        }

        debug_f_mp("provable_step p=", p);

        MillerRabin *mr = miller_rabin_new(p);
        debug_f("provable_step mr setup done");
        mp_int *witness = miller_rabin_find_potential_primitive_root(mr);
        miller_rabin_free(mr);

        if (!witness) {
            debug_f("provable_step mr failed");
            mp_free(p);
            continue;
        }

        size_t nfactors;
        mp_int **factors = pcs_get_known_prime_factors(pcs, &nfactors);
        PockleStatus st = pockle_add_prime(
            ppc->pockle, p, factors, nfactors, witness);

        if (st != POCKLE_OK) {
            debug_f("provable_step proof failed %d", (int)st);

            /*
             * Check by assertion that the error status is not one of
             * the ones we ought to have ruled out already by
             * construction. If there's a bug in this code that means
             * we can _never_ pass this test (e.g. picking products of
             * factors that never quite reach cbrt(n)), we'd rather
             * fail an assertion than loop forever.
             */
            assert(st == POCKLE_DISCRIMINANT_IS_SQUARE ||
                   st == POCKLE_WITNESS_POWER_IS_1 ||
                   st == POCKLE_WITNESS_POWER_NOT_COPRIME);

            mp_free(p);
            if (witness)
                mp_free(witness);
            continue;
        }

        mp_free(witness);
        pcs_free(pcs);
        debug_f_mp("ppgi(%u) done, got ", p, bits);
        progress_report(prog, progress_origin + progress_scale);
        return p;
    }
}